

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O3

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  bool bVar2;
  int32_t iVar3;
  Op opcode;
  _Head_base<2UL,_unsigned_int,_false> _Var4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  DiagnosticStream *pDVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  byte bVar13;
  size_type *psVar14;
  long lVar15;
  spv_result_t sVar16;
  char *pcVar17;
  size_t sVar18;
  string opcode_name;
  string local_290;
  string local_270;
  Instruction *local_250;
  Instruction *local_248;
  uint local_23c;
  string local_238;
  uint local_214;
  Instruction *local_210;
  undefined1 local_208 [5];
  char cStack_203;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined1 uStack_1f6;
  undefined5 uStack_1f5;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x29:
  case 0x2a:
  case 0x30:
  case 0x31:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) && ((pIVar10->inst_).opcode == 0x14))
    goto switchD_006171e9_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Op",2);
    local_270._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar17 = " is not a boolean type.";
    goto LAB_00617290;
  default:
    goto switchD_006171e9_caseD_2b;
  case 0x2c:
  case 0x33:
    local_1f8 = 0x704f;
    local_200 = 2;
    uStack_1f6 = 0;
    _local_208 = (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8;
    spvOpcodeString((uint)uVar1);
    plVar7 = (long *)std::__cxx11::string::append(local_208);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    psVar14 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_290.field_2._M_allocated_capacity = *psVar14;
      local_290.field_2._8_8_ = plVar7[3];
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar14;
      local_290._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_290._M_string_length = plVar7[1];
    *plVar7 = (long)psVar14;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (_local_208 != (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8) {
      operator_delete((void *)_local_208,CONCAT53(uStack_1f5,CONCAT12(uStack_1f6,local_1f8)) + 1);
    }
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 == (Instruction *)0x0) ||
       (iVar3 = spvOpcodeIsComposite((uint)(pIVar10->inst_).opcode), iVar3 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," Result Type <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar17 = " is not a composite type.";
      lVar15 = 0x19;
LAB_0061785d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
      sVar16 = local_38;
LAB_00617875:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
LAB_0061787a:
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0061788f;
    }
    lVar15 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar8 = lVar15 - 3;
    uVar1 = (pIVar10->inst_).opcode;
    sVar16 = SPV_SUCCESS;
    if (0x1167 < uVar1) {
      if ((uVar1 != 0x1168) && (uVar1 != 0x14ee)) {
        if (uVar1 == 0x14a8) goto switchD_00617696_caseD_17;
        goto switchD_00617696_caseD_19;
      }
      if (uVar8 != 1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar17 = " count must be one.";
        lVar15 = 0x13;
        goto LAB_0061785d;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar11 = ValidationState_t::FindDef(_,uVar5);
      if ((pIVar11 == (Instruction *)0x0) ||
         (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
LAB_00617ec0:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," is not a constant or undef.",0x1c);
        sVar16 = local_38;
LAB_00617f48:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pIVar12 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
        if (pIVar12 != (Instruction *)0x0) {
          local_248 = pIVar12;
          uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 != (Instruction *)0x0) &&
             ((pIVar11->inst_).result_id == (local_248->inst_).result_id))
          goto switchD_00617696_caseD_19;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"s component type.",0x11);
LAB_00617b0c:
          sVar16 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00617f48;
        }
LAB_00618250:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Result type is not defined.",0x1b);
        sVar16 = local_38;
      }
LAB_00617f62:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      goto switchD_00617696_caseD_19;
    }
    switch(uVar1) {
    case 0x17:
switchD_00617696_caseD_17:
      _Var4._M_head_impl = ValidationState_t::GetDimension(_,(pIVar10->inst_).result_id);
      if ((pIVar10->inst_).opcode == 0x14a8) {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
        ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar5);
        bVar13 = local_208[4] ^ 1;
        _Var4._M_head_impl = local_208._0_4_;
      }
      else {
        bVar13 = 0;
      }
      if ((bVar13 == 0) && (uVar8 != _Var4._M_head_impl)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar17 = "s vector component count.";
        lVar15 = 0x19;
LAB_006180c1:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
        sVar16 = local_38;
        goto LAB_00617875;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      local_248 = ValidationState_t::FindDef(_,uVar5);
      pIVar11 = pIVar10;
      if (local_248 == (Instruction *)0x0) goto LAB_00618353;
      sVar16 = SPV_SUCCESS;
      if (0x20 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar18 = 2;
        local_250 = pIVar10;
LAB_00617dd6:
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
        pIVar10 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar10 != (Instruction *)0x0) &&
           (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), bVar2)) {
          pIVar10 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
          if ((pIVar10 != (Instruction *)0x0) &&
             ((local_248->inst_).result_id == (pIVar10->inst_).result_id)) goto code_r0x00617e31;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          pcVar17 = "s vector element type.";
          lVar15 = 0x16;
LAB_006184ac:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
          sVar16 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
LAB_0061856c:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_0061787a;
          goto LAB_0061788f;
        }
        goto LAB_00617ec0;
      }
      break;
    case 0x18:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
      if (uVar8 != uVar5) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar17 = "s matrix column count.";
        lVar15 = 0x16;
        goto LAB_006180c1;
      }
      pIVar11 = ValidationState_t::FindDef
                          (_,(pIVar10->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2]);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar17 = "Column type is not defined.";
        lVar15 = 0x1b;
        goto LAB_00618364;
      }
      local_214 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      local_248 = ValidationState_t::FindDef(_,uVar5);
      if (local_248 != (Instruction *)0x0) {
        local_210 = pIVar11;
        if (0x20 < (ulong)((long)(inst->operands_).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          sVar18 = 2;
          local_250 = pIVar10;
LAB_00617728:
          local_23c = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
          pIVar10 = ValidationState_t::FindDef(_,local_23c);
          if ((pIVar10 != (Instruction *)0x0) &&
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar10->inst_).opcode), bVar2)) {
            pIVar11 = ValidationState_t::FindDef(_,(pIVar10->inst_).type_id);
            if (pIVar11 != (Instruction *)0x0) {
              if ((local_210->inst_).opcode != (pIVar11->inst_).opcode) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," Constituent <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," type does not match Result Type <id> ",0x26);
                ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"s matrix column type.",0x15);
LAB_006187cc:
                sVar16 = local_38;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_00618036;
                goto LAB_00617875;
              }
              uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
              pIVar10 = ValidationState_t::FindDef(_,uVar5);
              if ((local_248->inst_).result_id == (pIVar10->inst_).result_id) {
                if (local_214 ==
                    (pIVar11->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[3]) goto code_r0x006177cf;
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," Constituent <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,
                           " vector component count does not match Result Type <id> ",0x38);
                ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"s vector component count.",0x19);
                goto LAB_00617b0c;
              }
              ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," Constituent <id> ",0x12);
              ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208," component type does not match Result Type <id> ",
                         0x30);
              ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length)
              ;
              pcVar17 = "s matrix column component type.";
              lVar15 = 0x1f;
              goto LAB_00618019;
            }
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Result type is not defined.",0x1b);
            sVar16 = local_38;
            goto LAB_00617f62;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," is not a constant or undef.",0x1c);
          sVar16 = local_38;
          goto LAB_00617f48;
        }
        break;
      }
LAB_00618353:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
      pcVar17 = "Component type is not defined.";
      lVar15 = 0x1e;
      goto LAB_00618364;
    case 0x1c:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      local_248 = ValidationState_t::FindDef(_,uVar5);
      if (local_248 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar17 = "Element type is not defined.";
        lVar15 = 0x1c;
      }
      else {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
        if (pIVar11 != (Instruction *)0x0) {
          local_250 = pIVar10;
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)local_208,_,(pIVar11->inst_).result_id);
          if (((cStack_203 == '\x01') && (local_208[4] != false)) &&
             (uVar8 != ((ulong)_local_208 & 0xffffffff))) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent count does not match Result Type <id> ",
                       0x33);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(local_250->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            pcVar17 = "s array length.";
            lVar15 = 0xf;
            goto LAB_006180c1;
          }
          if (0x20 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            sVar18 = 2;
            do {
              uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
              pIVar11 = ValidationState_t::FindDef(_,uVar5);
              if ((pIVar11 == (Instruction *)0x0) ||
                 (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," Constituent <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," is not a constant or undef.",0x1c);
                sVar16 = local_38;
                goto LAB_0061856c;
              }
              pIVar10 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
              if (pIVar10 == (Instruction *)0x0) goto LAB_00618250;
              if ((local_248->inst_).result_id != (pIVar10->inst_).result_id) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," Constituent <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
                ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"s array element type.",0x15);
                goto LAB_006187cc;
              }
              sVar18 = sVar18 + 1;
            } while (sVar18 < (ulong)((long)(inst->operands_).
                                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inst->operands_).
                                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          break;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar17 = "Length is not defined.";
        lVar15 = 0x16;
      }
LAB_00618364:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
      sVar16 = local_38;
LAB_0061788f:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      break;
    case 0x1e:
      if ((long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 != lVar15 + -1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," count does not match Result Type <id> ",0x27);
        ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
        pcVar17 = "s struct member count.";
        lVar15 = 0x16;
LAB_00618019:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
        sVar16 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_00618036:
          sVar16 = local_38;
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00617875;
      }
      if (0x20 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar18 = 2;
        uVar5 = 3;
        local_250 = pIVar10;
        do {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar18);
          local_248 = (Instruction *)CONCAT44(local_248._4_4_,uVar6);
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 == (Instruction *)0x0) ||
             (bVar2 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar2)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(uint32_t)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," is not a constant or undef.",0x1c);
            sVar16 = local_38;
            goto LAB_0061856c;
          }
          pIVar10 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
          if (pIVar10 == (Instruction *)0x0) goto LAB_00618250;
          uVar6 = Instruction::GetOperandAs<unsigned_int>(local_250,(ulong)(uVar5 - 2));
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 == (Instruction *)0x0) ||
             ((pIVar11->inst_).result_id != (pIVar10->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(uint32_t)local_248);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
            ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_250->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
            pcVar17 = "s member type.";
            lVar15 = 0xe;
            goto LAB_006184ac;
          }
          sVar18 = (size_t)uVar5;
          uVar5 = uVar5 + 1;
        } while (sVar18 < (ulong)((long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
    }
switchD_00617696_caseD_19:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    goto LAB_006172cc;
  case 0x2d:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) && ((pIVar10->inst_).opcode == 0x1a))
    goto switchD_006171e9_caseD_2b;
    pDVar9 = (DiagnosticStream *)local_208;
    ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,pIVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,"OpConstantSampler Result Type <id> ",0x23);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar17 = " is not a sampler type.";
LAB_00617290:
    lVar15 = 0x17;
LAB_00617295:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9,pcVar17,lVar15);
    sVar16 = pDVar9->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x2e:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) &&
       (bVar2 = anon_unknown_1::IsTypeNullable(&pIVar10->words_,_), bVar2))
    goto switchD_006171e9_caseD_2b;
    pDVar9 = (DiagnosticStream *)local_208;
    ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,"OpConstantNull Result Type <id> ",0x20);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar17 = " cannot have a null value.";
    lVar15 = 0x1a;
    goto LAB_00617295;
  case 0x32:
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar5);
    if (0xfffffffd < (pIVar10->inst_).opcode - 0x17) goto switchD_006171e9_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar17 = "Specialization constant must be an integer or floating-point number.";
    lVar15 = 0x44;
LAB_006175de:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar17,lVar15);
    sVar16 = local_38;
    break;
  case 0x34:
    opcode = Instruction::GetOperandAs<spv::Op>(inst,2);
    uVar8 = (ulong)(opcode - OpAccessChain);
    if (opcode - OpAccessChain < 0x3f) {
      if ((0x4b90f00000000027U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x30) {
          if (((_->features_).uconvert_spec_constant_op != false) ||
             (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
             bVar2)) goto switchD_006171e9_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar17 = 
          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
          ;
          lVar15 = 0x80;
          goto LAB_006175de;
        }
        if (uVar8 != 0x33) goto LAB_00617921;
        bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (bVar2) goto switchD_006171e9_caseD_2b;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Specialization constant operation ",0x22);
        local_290._M_dataplus._M_p = spvOpcodeString(OpQuantizeToF16);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_290);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar9," requires Shader capability",0x1b);
        sVar16 = pDVar9->error_;
        break;
      }
    }
    else {
LAB_00617921:
      if ((0xc < opcode - OpFAdd) || ((0x1895U >> (opcode - OpFAdd & 0x1f) & 1) == 0))
      goto switchD_006171e9_caseD_2b;
    }
    bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
    if (bVar2) goto switchD_006171e9_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Specialization constant operation ",0x22);
    local_290._M_dataplus._M_p = spvOpcodeString(opcode);
    pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9," requires Kernel capability",0x1b);
    sVar16 = pDVar9->error_;
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_006172cc:
  if (sVar16 != SPV_SUCCESS) {
    return sVar16;
  }
switchD_006171e9_caseD_2b:
  iVar3 = spvOpcodeIsConstant((uint)(inst->inst_).opcode);
  sVar16 = SPV_SUCCESS;
  if ((((iVar3 != 0) &&
       (bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader), bVar2
       )) && (bVar2 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id),
             sVar16 = SPV_SUCCESS, !bVar2)) &&
     (bVar2 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id), bVar2))
  {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Cannot form constants of 8- or 16-bit types",0x2b);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar16 = local_38;
  }
  return sVar16;
code_r0x006177cf:
  sVar18 = sVar18 + 1;
  if ((ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) <= sVar18)
  goto switchD_00617696_caseD_19;
  goto LAB_00617728;
code_r0x00617e31:
  sVar18 = sVar18 + 1;
  if ((ulong)((long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(inst->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) <= sVar18)
  goto switchD_00617696_caseD_19;
  goto LAB_00617dd6;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}